

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

Token * __thiscall
toml::internal::Lexer::nextStringDoubleQuote(Token *__return_storage_ptr__,Lexer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  string codepoint;
  string s;
  string local_98;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  string local_58;
  uint local_34;
  
  cVar2 = std::istream::peek();
  if (cVar2 != '\"') {
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"string didn\'t start with \'\"\'","");
    __return_storage_ptr__->type_ = ERROR_TOKEN;
    (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_value_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->str_value_,local_78,local_78 + local_70);
    (__return_storage_ptr__->time_value_).__d.__r = 0;
    if (local_78 == &local_68) {
      return __return_storage_ptr__;
    }
    goto LAB_00132ee7;
  }
  iVar5 = std::istream::get();
  if (iVar5 == 10) {
    this->lineNo_ = this->lineNo_ + 1;
  }
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  bVar3 = std::istream::peek();
  local_34 = (uint)bVar3;
  if (local_34 == 0x22) {
    iVar5 = std::istream::get();
    if (iVar5 == 10) {
      this->lineNo_ = this->lineNo_ + 1;
    }
    cVar2 = std::istream::peek();
    if (cVar2 == '\"') {
      iVar5 = std::istream::get();
      while( true ) {
        if (iVar5 == 10) {
          this->lineNo_ = this->lineNo_ + 1;
        }
        uVar6 = std::istream::peek();
        if ((uVar6 == 0xffffffff) || (((char)uVar6 != ' ' && ((uVar6 & 0xff) != 9)))) break;
        iVar5 = std::istream::get();
      }
      cVar2 = std::istream::peek();
      if ((cVar2 == '\n') && (iVar5 = std::istream::get(), iVar5 == 10)) {
        this->lineNo_ = this->lineNo_ + 1;
      }
      goto LAB_00132f6f;
    }
    paVar1 = &local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->type_ = STRING;
    (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_value_).field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->str_value_,paVar1,paVar1);
    (__return_storage_ptr__->time_value_).__d.__r = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) goto LAB_001332ec;
  }
  else {
LAB_00132f6f:
LAB_00132f81:
    while (uVar6 = std::istream::peek(), uVar6 != 0xffffffff) {
      iVar5 = std::istream::get();
      if (iVar5 == 10) {
        this->lineNo_ = this->lineNo_ + 1;
      }
      cVar2 = (char)&local_78;
      if ((char)uVar6 == '\"') {
        if (local_34 == 0x22) {
          cVar4 = std::istream::peek();
          if (cVar4 == '\"') {
            iVar5 = std::istream::get();
            if (iVar5 == 10) {
              this->lineNo_ = this->lineNo_ + 1;
            }
            cVar4 = std::istream::peek();
            if (cVar4 == '\"') {
              iVar5 = std::istream::get();
              if (iVar5 == 10) {
                this->lineNo_ = this->lineNo_ + 1;
              }
              __return_storage_ptr__->type_ = MULTILINE_STRING;
              (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->str_value_).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__return_storage_ptr__->str_value_,local_78,local_78 + local_70)
              ;
              goto LAB_00133330;
            }
            std::__cxx11::string::push_back(cVar2);
          }
          goto LAB_00133089;
        }
        __return_storage_ptr__->type_ = STRING;
        (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->str_value_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->str_value_,local_78,local_78 + local_70);
LAB_00133330:
        (__return_storage_ptr__->time_value_).__d.__r = 0;
        goto LAB_00133338;
      }
      if ((uVar6 & 0xff) != 0x5c) goto LAB_00133089;
      uVar6 = std::istream::peek();
      if (uVar6 == 0xffffffff) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"string has unknown escape sequence","");
        __return_storage_ptr__->type_ = ERROR_TOKEN;
        (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->str_value_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->str_value_,local_98._M_dataplus._M_p,
                   local_98._M_dataplus._M_p + local_98._M_string_length);
        goto LAB_001332d6;
      }
      iVar5 = std::istream::get();
      if (iVar5 == 10) {
        this->lineNo_ = this->lineNo_ + 1;
      }
      uVar7 = uVar6 & 0xff;
      if (uVar7 < 0x55) {
        if (uVar7 != 10) {
          if ((uVar7 == 0x22) || (uVar7 == 0x27)) goto LAB_00133089;
          goto switchD_001330b0_caseD_6f;
        }
        while (((uVar6 = std::istream::peek(), uVar6 != 0xffffffff && ((byte)uVar6 < 0x21)) &&
               ((0x100002600U >> ((ulong)(uVar6 & 0xff) & 0x3f) & 1) != 0))) {
          iVar5 = std::istream::get();
          if (iVar5 == 10) {
            this->lineNo_ = this->lineNo_ + 1;
          }
        }
      }
      else {
        switch(uVar7) {
        case 0x6e:
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
          goto switchD_001330b0_caseD_6f;
        case 0x72:
          break;
        case 0x74:
          break;
        case 0x75:
          goto switchD_001330b0_caseD_75;
        default:
          if (uVar7 == 0x55) goto switchD_001330b0_caseD_75;
          if (uVar7 == 0x5c) break;
          goto switchD_001330b0_caseD_6f;
        }
LAB_00133089:
        std::__cxx11::string::push_back(cVar2);
      }
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"string didn\'t end","");
    __return_storage_ptr__->type_ = ERROR_TOKEN;
    (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_value_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->str_value_,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
LAB_001332d6:
    (__return_storage_ptr__->time_value_).__d.__r = 0;
LAB_001332de:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_001332ec:
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
  }
LAB_00133338:
  if (local_78 == &local_68) {
    return __return_storage_ptr__;
  }
LAB_00132ee7:
  operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  return __return_storage_ptr__;
switchD_001330b0_caseD_75:
  iVar5 = (uint)((char)uVar6 != 'u') * 4 + 4;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  do {
    uVar6 = std::istream::peek();
    if ((uVar6 == 0xffffffff) ||
       ((9 < (byte)((char)uVar6 - 0x30U) &&
        ((uVar6 = (uVar6 & 0xff) - 0x41, 0x25 < uVar6 ||
         ((0x3f0000003fU >> ((ulong)uVar6 & 0x3f) & 1) == 0)))))) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"string has unknown escape sequence","");
      __return_storage_ptr__->type_ = ERROR_TOKEN;
      (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->str_value_).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->str_value_,local_58._M_dataplus._M_p,
                 local_58._M_dataplus._M_p + local_58._M_string_length);
      (__return_storage_ptr__->time_value_).__d.__r = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001332de;
    }
    std::__cxx11::string::push_back((char)&local_98);
    iVar8 = std::istream::get();
    if (iVar8 == 10) {
      this->lineNo_ = this->lineNo_ + 1;
    }
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  unescape(&local_58,&local_98);
  std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  goto LAB_00132f81;
switchD_001330b0_caseD_6f:
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"string has unknown escape sequence","");
  __return_storage_ptr__->type_ = ERROR_TOKEN;
  (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->str_value_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->str_value_,local_98._M_dataplus._M_p,
             local_98._M_dataplus._M_p + local_98._M_string_length);
  goto LAB_001332d6;
}

Assistant:

inline Token Lexer::nextStringDoubleQuote()
{
    if (!consume('"'))
        return Token(TokenType::ERROR_TOKEN, std::string("string didn't start with '\"'"));

    std::string s;
    char c;
    bool multiline = false;

    if (current(&c) && c == '"') {
        next();
        if (!current(&c) || c != '"') {
            // OK. It's empty string.
            return Token(TokenType::STRING, std::string());
        }

        next();
        // raw string literal started.
        // Newline just after """ should be ignored.
        while (current(&c) && (c == ' ' || c == '\t'))
            next();
        if (current(&c) && c == '\n')
            next();
        multiline = true;
    }

    while (current(&c)) {
        next();
        if (c == '\\') {
            if (!current(&c))
                return Token(TokenType::ERROR_TOKEN, std::string("string has unknown escape sequence"));
            next();
            switch (c) {
            case 't': c = '\t'; break;
            case 'n': c = '\n'; break;
            case 'r': c = '\r'; break;
            case 'u':
            case 'U': {
                int size = c == 'u' ? 4 : 8;
                std::string codepoint;
                for (int i = 0; i < size; ++i) {
                  if (current(&c) && (('0' <= c && c <= '9') || ('A' <= c && c <= 'F') || ('a' <= c && c <= 'f'))) {
                    codepoint += c;
                    next();
                  } else {
                    return Token(TokenType::ERROR_TOKEN, std::string("string has unknown escape sequence"));
                  }
                }
                s += unescape(codepoint);
                continue;
            }
            case '"': c = '"'; break;
            case '\'': c = '\''; break;
            case '\\': c = '\\'; break;
            case '\n':
                while (current(&c) && (c == ' ' || c == '\t' || c == '\r' || c == '\n')) {
                    next();
                }
                continue;
            default:
                return Token(TokenType::ERROR_TOKEN, std::string("string has unknown escape sequence"));
            }
        } else if (c == '"') {
            if (multiline) {
                if (current(&c) && c == '"') {
                    next();
                    if (current(&c) && c == '"') {
                        next();
                        return Token(TokenType::MULTILINE_STRING, s);
                    } else {
                        s += '"';
                        s += '"';
                        continue;
                    }
                } else {
                    s += '"';
                    continue;
                }
            } else {
                return Token(TokenType::STRING, s);
            }
        }

        s += c;
    }

    return Token(TokenType::ERROR_TOKEN, std::string("string didn't end"));
}